

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O0

void __thiscall clickhouse::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64_t value)

{
  ulong in_RSI;
  void *in_RDI;
  uint8_t byte;
  size_t i;
  int size;
  uint8_t bytes [10];
  undefined7 in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd7;
  ulong local_28;
  int local_20;
  byte local_1a [10];
  ulong local_10;
  
  local_20 = 0;
  local_10 = in_RSI;
  for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
    in_stack_ffffffffffffffd7 = (byte)local_10 & 0x7f;
    if (0x7f < local_10) {
      in_stack_ffffffffffffffd7 = in_stack_ffffffffffffffd7 | 0x80;
    }
    local_1a[local_20] = in_stack_ffffffffffffffd7;
    local_10 = local_10 >> 7;
    if (local_10 == 0) break;
    local_20 = local_20 + 1;
  }
  WriteRaw((CodedOutputStream *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI
           ,0);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64_t value) {
    uint8_t bytes[MAX_VARINT_BYTES];
    int size = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte = value & 0x7F;
        if (value > 0x7F)
            byte |= 0x80;

        bytes[size++] = byte;

        value >>= 7;
        if (!value) {
            break;
        }
    }

    WriteRaw(bytes, size);
}